

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChShaft::IntStateScatter
          (ChShaft *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,bool full_update)

{
  CoeffReturnType pdVar1;
  undefined3 in_register_00000089;
  
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,(ulong)off_x);
  this->pos = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)v,(ulong)off_v);
  this->pos_dt = *pdVar1;
  (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (T,this,(ulong)CONCAT31(in_register_00000089,full_update));
  return;
}

Assistant:

void ChShaft::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                              const ChState& x,          // state vector, position part
                              const unsigned int off_v,  // offset in v state vector
                              const ChStateDelta& v,     // state vector, speed part
                              const double T,            // time
                              bool full_update           // perform complete update
) {
    SetPos(x(off_x));
    SetPos_dt(v(off_v));
    Update(T, full_update);
}